

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void roundFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  long lVar1;
  int iVar2;
  undefined8 *in_RDX;
  int in_ESI;
  long in_FS_OFFSET;
  char *zFormat;
  char *zBuf;
  i64 n;
  double r;
  char *in_stack_00000040;
  char *in_stack_ffffffffffffffb8;
  sqlite3_context *in_stack_ffffffffffffffc0;
  ulong local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = 0;
  if (in_ESI == 2) {
    iVar2 = sqlite3_value_type((sqlite3_value *)in_RDX[1]);
    if (iVar2 == 5) goto LAB_002242b4;
    local_30 = sqlite3_value_int64((sqlite3_value *)0x22416d);
    if (0x1e < (long)local_30) {
      local_30 = 0x1e;
    }
    if ((long)local_30 < 0) {
      local_30 = 0;
    }
  }
  iVar2 = sqlite3_value_type((sqlite3_value *)*in_RDX);
  if (iVar2 != 5) {
    zFormat = (char *)sqlite3_value_double((sqlite3_value *)0x2241ba);
    if (((-4503599627370496.0 <= (double)zFormat) && ((double)zFormat <= 4503599627370496.0)) &&
       (local_30 != 0)) {
      in_stack_ffffffffffffffc0 =
           (sqlite3_context *)sqlite3_mprintf(zFormat,"%!.*f",local_30 & 0xffffffff);
      if (in_stack_ffffffffffffffc0 == (sqlite3_context *)0x0) {
        sqlite3_result_error_nomem((sqlite3_context *)0x22426c);
        goto LAB_002242b4;
      }
      sqlite3Strlen30(in_stack_ffffffffffffffb8);
      sqlite3AtoF(in_stack_00000040,(double *)r,context._4_4_,context._3_1_);
      sqlite3_free((void *)0x2242a2);
    }
    sqlite3_result_double(in_stack_ffffffffffffffc0,(double)in_stack_ffffffffffffffb8);
  }
LAB_002242b4:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void roundFunc(sqlite3_context *context, int argc, sqlite3_value **argv){
  i64 n = 0;
  double r;
  char *zBuf;
  assert( argc==1 || argc==2 );
  if( argc==2 ){
    if( SQLITE_NULL==sqlite3_value_type(argv[1]) ) return;
    n = sqlite3_value_int64(argv[1]);
    if( n>30 ) n = 30;
    if( n<0 ) n = 0;
  }
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  r = sqlite3_value_double(argv[0]);
  /* If Y==0 and X will fit in a 64-bit int,
  ** handle the rounding directly,
  ** otherwise use printf.
  */
  if( r<-4503599627370496.0 || r>+4503599627370496.0 ){
    /* The value has no fractional part so there is nothing to round */
  }else if( n==0 ){
    r = (double)((sqlite_int64)(r+(r<0?-0.5:+0.5)));
  }else{
    zBuf = sqlite3_mprintf("%!.*f",(int)n,r);
    if( zBuf==0 ){
      sqlite3_result_error_nomem(context);
      return;
    }
    sqlite3AtoF(zBuf, &r, sqlite3Strlen30(zBuf), SQLITE_UTF8);
    sqlite3_free(zBuf);
  }
  sqlite3_result_double(context, r);
}